

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiniscriptTypes.cpp
# Opt level: O0

String __thiscall MiniScript::Value::ToString(Value *this,Machine *vm)

{
  double __x;
  ulong uVar1;
  long lVar2;
  uchar uVar3;
  size_t sVar4;
  long lVar5;
  FuncParam *pFVar6;
  int in_EDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  undefined8 extraout_RDX_05;
  undefined8 extraout_RDX_06;
  undefined8 extraout_RDX_07;
  undefined8 extraout_RDX_08;
  bool bVar8;
  double dVar9;
  String SVar10;
  String local_170;
  String local_160;
  Value local_150;
  Value local_140;
  String local_130;
  String local_120;
  undefined1 local_109;
  long local_108;
  SeqElemStorage *se;
  String local_f0;
  String local_e0;
  String local_d0;
  long local_c0;
  long i_1;
  FunctionStorage *fs;
  String s_1;
  String local_90;
  undefined4 local_7c;
  String local_78;
  undefined1 local_68 [8];
  String ident;
  size_t local_38;
  long i;
  double value;
  Machine *vm_local;
  Value *this_local;
  String *s;
  undefined8 uVar7;
  
  if (*(char *)&vm->standardOutput == '\x01') {
    __x = *(double *)&vm->storeImplicit;
    dVar9 = fmod(__x,1.0);
    if ((dVar9 != 0.0) || (NAN(dVar9))) {
      if (((10000000000.0 < __x) || (__x < -10000000000.0)) || ((__x < 1e-06 && (-1e-06 < __x)))) {
        SVar10 = String::Format((String *)this,__x,"%.6E");
        uVar7 = SVar10._8_8_;
      }
      else {
        String::Format((String *)this,__x,"%.6f");
        local_38 = String::LengthB((String *)this);
        do {
          uVar1 = local_38;
          local_38 = uVar1 - 1;
          bVar8 = false;
          if (1 < (long)local_38) {
            uVar3 = String::operator[]((String *)this,local_38);
            bVar8 = false;
            if (uVar3 == '0') {
              uVar3 = String::operator[]((String *)this,uVar1 - 2);
              bVar8 = uVar3 != '.';
            }
          }
        } while (bVar8);
        sVar4 = String::LengthB((String *)this);
        uVar7 = extraout_RDX;
        if (uVar1 < sVar4) {
          String::SubstringB((String *)&ident.isTemp,(long)this,0);
          String::operator=((String *)this,(String *)&ident.isTemp);
          String::~String((String *)&ident.isTemp);
          uVar7 = extraout_RDX_00;
        }
      }
    }
    else {
      SVar10 = String::Format((String *)this,__x,"%.0f");
      uVar7 = SVar10._8_8_;
    }
  }
  else if (*(char *)&vm->standardOutput == '\x03') {
    retain((Value *)vm);
    String::String((String *)this,*(StringStorage **)&vm->storeImplicit,false);
    uVar7 = extraout_RDX_01;
  }
  else if (*(char *)&vm->standardOutput == '\x04') {
    SVar10 = CodeForm(this,vm,in_EDX);
    uVar7 = SVar10._8_8_;
  }
  else if (*(char *)&vm->standardOutput == '\x05') {
    SVar10 = CodeForm(this,vm,in_EDX);
    uVar7 = SVar10._8_8_;
  }
  else if (*(char *)&vm->standardOutput == '\a') {
    retain((Value *)vm);
    String::String((String *)local_68,*(StringStorage **)&vm->storeImplicit,false);
    if (((ulong)vm->standardOutput & 0x100) == 0) {
      String::String((String *)this,(String *)local_68);
    }
    else {
      String::String(&local_78,"@");
      String::operator+((String *)this,&local_78);
      String::~String(&local_78);
    }
    local_7c = 1;
    String::~String((String *)local_68);
    uVar7 = extraout_RDX_02;
  }
  else if (*(char *)&vm->standardOutput == '\x02') {
    String::String(&local_90,"_");
    String::Format((String *)&s_1.isTemp,*(int *)&vm->storeImplicit,"%d");
    String::operator+((String *)this,&local_90);
    String::~String((String *)&s_1.isTemp);
    String::~String(&local_90);
    uVar7 = extraout_RDX_03;
  }
  else if (*(char *)&vm->standardOutput == '\x06') {
    String::String((String *)&fs,"FUNCTION(");
    i_1 = *(long *)&vm->storeImplicit;
    for (local_c0 = 0; lVar2 = local_c0,
        lVar5 = List<MiniScript::FuncParam>::Count((List<MiniScript::FuncParam> *)(i_1 + 0x10)),
        lVar2 < lVar5; local_c0 = local_c0 + 1) {
      if (0 < local_c0) {
        String::String(&local_d0,", ");
        String::operator+=((String *)&fs,&local_d0);
        String::~String(&local_d0);
      }
      pFVar6 = List<MiniScript::FuncParam>::operator[]
                         ((List<MiniScript::FuncParam> *)(i_1 + 0x10),local_c0);
      String::operator+=((String *)&fs,&pFVar6->name);
      pFVar6 = List<MiniScript::FuncParam>::operator[]
                         ((List<MiniScript::FuncParam> *)(i_1 + 0x10),local_c0);
      bVar8 = IsNull(&pFVar6->defaultValue);
      if (!bVar8) {
        String::String(&local_f0,"=");
        pFVar6 = List<MiniScript::FuncParam>::operator[]
                           ((List<MiniScript::FuncParam> *)(i_1 + 0x10),local_c0);
        CodeForm((Value *)&se,(Machine *)&pFVar6->defaultValue,in_EDX);
        String::operator+(&local_e0,&local_f0);
        String::operator+=((String *)&fs,&local_e0);
        String::~String(&local_e0);
        String::~String((String *)&se);
        String::~String(&local_f0);
      }
    }
    String::operator+((String *)this,(char *)&fs);
    local_7c = 1;
    String::~String((String *)&fs);
    uVar7 = extraout_RDX_04;
  }
  else if (*(char *)&vm->standardOutput == '\b') {
    local_108 = *(long *)&vm->storeImplicit;
    local_109 = 0;
    ToString(&local_140,(Machine *)(local_108 + 0x10));
    String::operator+(&local_130,(char *)&local_140);
    ToString(&local_150,(Machine *)(local_108 + 0x20));
    String::operator+(&local_120,&local_130);
    String::operator+((String *)this,(char *)&local_120);
    String::~String(&local_120);
    String::~String((String *)&local_150);
    String::~String(&local_130);
    String::~String((String *)&local_140);
    uVar7 = extraout_RDX_05;
    if (((ulong)vm->standardOutput & 0x100) != 0) {
      String::String(&local_170,"@");
      String::operator+(&local_160,&local_170);
      String::operator=((String *)this,&local_160);
      String::~String(&local_160);
      String::~String(&local_170);
      uVar7 = extraout_RDX_06;
    }
  }
  else if (*(char *)&vm->standardOutput == '\t') {
    String::String((String *)this,"Handle");
    uVar7 = extraout_RDX_07;
  }
  else {
    String::String((String *)this);
    uVar7 = extraout_RDX_08;
  }
  SVar10._8_8_ = uVar7;
  SVar10.ss = (StringStorage *)this;
  return SVar10;
}

Assistant:

String Value::ToString(Machine *vm) {
		if (type == ValueType::Number) {
			// Convert number to string in the standard Miniscript way.
			double value = data.number;
			if (fmod(value, 1.0) == 0.0) {
				return String::Format(value, "%.0f");
			} else if (value > 1E10 || value < -1E10 || (value < 1E-6 && value > -1E-6)) {
				// very large/small numbers in exponential form
				return String::Format(value, "%.6E");
			} else {
				// all others in decimal form, with 1-6 digits past the decimal point
				String s = String::Format(value, "%.6f");
				long i = s.LengthB() - 1;
				while (i > 1 && s[i] == '0' && s[i-1] != '.') i--;
				if (i+1 < s.LengthB()) s = s.SubstringB(0, i+1);
				return s;
			}
		}
		if (type == ValueType::String) { retain(); return String((StringStorage*)data.ref, false); }
		if (type == ValueType::List) return CodeForm(vm, 3);
		if (type == ValueType::Map) return CodeForm(vm, 3);
		if (type == ValueType::Var) {
			retain();
			String ident((StringStorage*)data.ref, false);
			if (noInvoke) return String("@") + ident;
			return ident;
		}
		if (type == ValueType::Temp) return String("_") + String::Format((int)data.tempNum);
		if (type == ValueType::Function) {
			String s("FUNCTION(");
			FunctionStorage *fs = (FunctionStorage*)data.ref;
			for (long i=0; i < fs->parameters.Count(); i++) {
				if (i > 0) s += ", ";
				s += fs->parameters[i].name;
				if (not fs->parameters[i].defaultValue.IsNull()) s += String("=") + fs->parameters[i].defaultValue.CodeForm(vm);
			}
			return s + ")";
		}
		if (type == ValueType::SeqElem) {
			SeqElemStorage *se = (SeqElemStorage*)data.ref;
			String s = se->sequence.ToString(vm) + "[" + se->index.ToString(vm) + "]";
			if (noInvoke) s = String("@") + s;
			return s;
		}
		if (type == ValueType::Handle) {
			return "Handle";
		}
		return String();
	}